

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

int __thiscall QDate::dayOfYear(QDate *this,QCalendar cal)

{
  int year;
  QDate QVar1;
  int iVar2;
  long in_FS_OFFSET;
  QCalendar local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  local_38.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    year = QDate::year(this,cal);
    QVar1 = QCalendar::dateFromParts(&local_38,year,1,1);
    if ((QVar1.jd + 0xb69eeff91fU < 0x16d3e147974) &&
       (iVar2 = ((int)this->jd - (int)QVar1.jd) + 1, this->jd - 0xb69f248055U < 0xfffffe92c1eb868c))
    {
      iVar2 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QDate::dayOfYear(QCalendar cal) const
{
    if (isValid()) {
        QDate firstDay = cal.dateFromParts(year(cal), 1, 1);
        if (firstDay.isValid())
            return firstDay.daysTo(*this) + 1;
    }
    return 0;
}